

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::ClassId
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  TPZStackEqnStorage<double> *in_RDI;
  allocator<char> *in_stack_fffffffffffe04d0;
  char *in_stack_fffffffffffe04d8;
  TPZStackEqnStorage<double> *in_stack_fffffffffffe04e0;
  TPZFrontSym<double> *in_stack_fffffffffffe04f0;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffe04e0,in_stack_fffffffffffe04d8,in_stack_fffffffffffe04d0);
  uVar1 = Hash((string *)in_RDI);
  iVar2 = TPZAbstractFrontMatrix<double>::ClassId
                    ((TPZAbstractFrontMatrix<double> *)in_stack_fffffffffffe04f0);
  uVar1 = uVar1 ^ iVar2 * 2;
  TPZStackEqnStorage<double>::TPZStackEqnStorage(in_RDI);
  iVar2 = TPZStackEqnStorage<double>::ClassId(in_stack_fffffffffffe04e0);
  TPZFrontSym<double>::TPZFrontSym((TPZFrontSym<double> *)CONCAT44(uVar1,iVar2));
  iVar3 = TPZFrontSym<double>::ClassId(in_stack_fffffffffffe04f0);
  TPZFrontSym<double>::~TPZFrontSym((TPZFrontSym<double> *)0x1cda466);
  TPZStackEqnStorage<double>::~TPZStackEqnStorage((TPZStackEqnStorage<double> *)0x1cda473);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 << 2 ^ iVar3 << 3;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}